

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *
__thiscall
libtorrent::aux::piece_picker::get_downloaders
          (vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           *__return_storage_ptr__,piece_picker *this,piece_index_t index)

{
  pointer *ppptVar1;
  int iVar2;
  pointer ppVar3;
  iterator __position;
  iterator iVar4;
  int iVar5;
  uint uVar6;
  download_queue_t queue;
  ulong uVar7;
  pointer __args;
  value_type local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar3 = (this->m_piece_map).
           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)(ppVar3 + index.m_val);
  queue.m_val = (byte)(uVar6 >> 0x1a) & 7;
  if (queue.m_val == 5) {
    queue.m_val = '\0';
  }
  else if ((uVar6 >> 0x1a & 7) == 6) {
    queue.m_val = '\x01';
  }
  if (index.m_val + 1 ==
      (int)((ulong)((long)(this->m_piece_map).
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          .
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3)) {
    uVar6 = (uint)this->m_blocks_in_last_piece;
  }
  else {
    iVar2 = this->m_piece_size;
    iVar5 = 0x4000;
    if (iVar2 < 0x4000) {
      iVar5 = iVar2;
    }
    uVar6 = (iVar2 + iVar5 + -1) / iVar5;
  }
  ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  reserve(__return_storage_ptr__,(long)(int)uVar6);
  if (queue.m_val == '\x04') {
    local_38 = (value_type)0x0;
    ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::resize(__return_storage_ptr__,(long)(int)uVar6,&local_38);
  }
  else {
    iVar4 = find_dl_piece(this,queue,index);
    iVar2 = this->m_piece_size;
    iVar5 = 0x4000;
    if (iVar2 < 0x4000) {
      iVar5 = iVar2;
    }
    if (uVar6 != 0) {
      __args = (this->m_block_info).
               super_vector<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
               .
               super__Vector_base<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (int)(((iVar2 + iVar5 + -1) / iVar5) * (uint)(iVar4._M_current)->info_idx);
      uVar7 = (ulong)uVar6;
      do {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>::
          _M_realloc_insert<libtorrent::aux::torrent_peer*const&>
                    ((vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>
                      *)__return_storage_ptr__,__position,&__args->peer);
        }
        else {
          *__position._M_current = __args->peer;
          ppptVar1 = &(__return_storage_ptr__->
                      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar1 = *ppptVar1 + 1;
        }
        __args = __args + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<aux::torrent_peer*> piece_picker::get_downloaders(piece_index_t const index) const
	{
		std::vector<aux::torrent_peer*> d;
		auto const state = m_piece_map[index].download_queue();
		int const num_blocks = blocks_in_piece(index);
		d.reserve(aux::numeric_cast<std::size_t>(num_blocks));

		if (state == piece_pos::piece_open)
		{
			d.resize(std::size_t(num_blocks), nullptr);
			return d;
		}

		auto const i = find_dl_piece(state, index);
		TORRENT_ASSERT(i != m_downloads[state].end());
		auto const binfo = blocks_for_piece(*i);
		for (int j = 0; j != num_blocks; ++j)
		{
			TORRENT_ASSERT(binfo[j].peer == nullptr
				|| binfo[j].peer->in_use);
			d.push_back(binfo[j].peer);
		}
		return d;
	}